

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_ssse3.c
# Opt level: O0

void cfl_luma_subsampling_422_lbd_ssse3
               (uint8_t *input,int input_stride,uint16_t *pred_buf_q3,int width,int height)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int in_ECX;
  __m128i *in_RDX;
  int iVar6;
  longlong in_RSI;
  __m128i *in_RDI;
  int in_R8D;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar7 [16];
  __m128i alVar8;
  __m128i top_1;
  __m128i top_3;
  __m128i top_2;
  __m128i top;
  __m128i *end;
  __m128i *pred_buf_m128i;
  __m128i fours;
  longlong local_1c8;
  longlong lStack_1c0;
  longlong local_1b8;
  longlong lStack_1b0;
  longlong local_1a8;
  __m128i *local_180;
  __m128i *local_148;
  
  iVar6 = (int)in_RSI;
  local_180 = in_RDX;
  local_148 = in_RDI;
  do {
    if (in_ECX == 4) {
      alVar8 = _mm_loadh_epi32(local_148);
      auVar5._8_8_ = extraout_XMM0_Qb;
      auVar5._0_8_ = extraout_XMM0_Qa;
      auVar4._8_8_ = 0x404040404040404;
      auVar4._0_8_ = 0x404040404040404;
      pmaddubsw(auVar5,auVar4);
      alVar8[0] = in_RSI;
      _mm_storeh_epi32(local_180,alVar8);
    }
    else if (in_ECX == 8) {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (*local_148)[0];
      auVar2._8_8_ = 0x404040404040404;
      auVar2._0_8_ = 0x404040404040404;
      auVar7 = pmaddubsw(auVar3,auVar2);
      local_1a8 = auVar7._0_8_;
      (*local_180)[0] = local_1a8;
    }
    else {
      auVar7._8_8_ = 0x404040404040404;
      auVar7._0_8_ = 0x404040404040404;
      auVar7 = pmaddubsw((undefined1  [16])*local_148,auVar7);
      local_1b8 = auVar7._0_8_;
      lStack_1b0 = auVar7._8_8_;
      (*local_180)[0] = local_1b8;
      (*local_180)[1] = lStack_1b0;
      if (in_ECX == 0x20) {
        auVar1._8_8_ = 0x404040404040404;
        auVar1._0_8_ = 0x404040404040404;
        auVar7 = pmaddubsw((undefined1  [16])local_148[1],auVar1);
        local_1c8 = auVar7._0_8_;
        lStack_1c0 = auVar7._8_8_;
        local_180[1][0] = local_1c8;
        local_180[1][1] = lStack_1c0;
      }
    }
    local_148 = (__m128i *)((long)*local_148 + (long)iVar6);
    local_180 = local_180 + 4;
  } while (local_180 < in_RDX + (in_R8D << 2));
  return;
}

Assistant:

static inline void cfl_luma_subsampling_422_lbd_ssse3(const uint8_t *input,
                                                      int input_stride,
                                                      uint16_t *pred_buf_q3,
                                                      int width, int height) {
  const __m128i fours = _mm_set1_epi8(4);
  __m128i *pred_buf_m128i = (__m128i *)pred_buf_q3;
  const __m128i *end = pred_buf_m128i + height * CFL_BUF_LINE_I128;
  do {
    if (width == 4) {
      __m128i top = _mm_loadh_epi32((__m128i *)input);
      top = _mm_maddubs_epi16(top, fours);
      _mm_storeh_epi32(pred_buf_m128i, top);
    } else if (width == 8) {
      __m128i top = _mm_loadl_epi64((__m128i *)input);
      top = _mm_maddubs_epi16(top, fours);
      _mm_storel_epi64(pred_buf_m128i, top);
    } else {
      __m128i top = _mm_loadu_si128((__m128i *)input);
      top = _mm_maddubs_epi16(top, fours);
      _mm_storeu_si128(pred_buf_m128i, top);
      if (width == 32) {
        __m128i top_1 = _mm_loadu_si128(((__m128i *)input) + 1);
        top_1 = _mm_maddubs_epi16(top_1, fours);
        _mm_storeu_si128(pred_buf_m128i + 1, top_1);
      }
    }
    input += input_stride;
    pred_buf_m128i += CFL_BUF_LINE_I128;
  } while (pred_buf_m128i < end);
}